

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O0

uint32_t helper_uhadd8_aarch64(uint32_t a,uint32_t b)

{
  uint32_t res;
  uint32_t b_local;
  uint32_t a_local;
  
  return ((a >> 0x18) + (b >> 0x18) >> 1) << 0x18 |
         ((a >> 0x10 & 0xff) + (b >> 0x10 & 0xff) >> 1) << 0x10 |
         ((a >> 8 & 0xff) + (b >> 8 & 0xff) >> 1) << 8 | (a & 0xff) + (b & 0xff) >> 1;
}

Assistant:

uint32_t HELPER(glue(PFX,add8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD8(a, b, 0);
    ADD8(a >> 8, b >> 8, 1);
    ADD8(a >> 16, b >> 16, 2);
    ADD8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}